

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_member_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  uint32_t id;
  Decoration *pDVar1;
  bool bVar2;
  undefined8 in_RAX;
  mapped_type *pmVar3;
  uint *ts_1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  while( true ) {
    id = (type->type_alias).id;
    if (id == 0) break;
    bVar2 = Compiler::has_extended_decoration
                      (&this->super_Compiler,id,SPIRVCrossDecorationBufferBlockRepacked);
    if (bVar2) break;
    type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->type_alias).id);
  }
  uStack_28 = CONCAT44(index,(undefined4)uStack_28);
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  ts_1 = (uint *)(ulong)index;
  if (ts_1 < (uint *)(pmVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size)
  {
    pDVar1 = (pmVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    if (pDVar1[(long)ts_1].alias._M_string_length != 0) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)(pDVar1 + (long)ts_1));
      return __return_storage_ptr__;
    }
  }
  join<char_const(&)[3],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)0x3935de,(char (*) [3])((long)&uStack_28 + 4),
             ts_1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_member_name(const SPIRType &type, uint32_t index)
{
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
	{
		return to_member_name(get<SPIRType>(type.type_alias), index);
	}

	auto &memb = ir.meta[type.self].members;
	if (index < memb.size() && !memb[index].alias.empty())
		return memb[index].alias;
	else
		return join("_m", index);
}